

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_EnhancedRotaryWingAircraft.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GED_EnhancedRotaryWingAircraft::Encode
          (GED_EnhancedRotaryWingAircraft *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  GED_EnhancedRotaryWingAircraft *this_local;
  
  GED_BasicRotorWingAircraft::Encode(&this->super_GED_BasicRotorWingAircraft,stream);
  pKVar1 = KDataStream::operator<<(stream,(this->super_GED_BasicRotorWingAircraft).field_0x2c);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_GED_BasicRotorWingAircraft).field_0x2d);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_GED_BasicRotorWingAircraft).field_0x2e);
  KDataStream::operator<<(pKVar1,(this->super_GED_BasicRotorWingAircraft).field_0x2f);
  return;
}

Assistant:

void GED_EnhancedRotaryWingAircraft::Encode( KDataStream & stream ) const
{
    GED_BasicRotorWingAircraft::Encode( stream );

    stream << m_ui8SupFuelStatus
           << m_ui8AirMaintStatus
           << m_ui8PriAmmun
           << m_ui8SecAmmun;
}